

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_function.cpp
# Opt level: O0

char * prototype_string(glsl_type *return_type,char *name,exec_list *parameters)

{
  bool bVar1;
  long local_68;
  long local_60;
  long local_50;
  long local_48;
  long local_38;
  ir_variable *param;
  char *comma;
  char *str;
  exec_list *parameters_local;
  char *name_local;
  glsl_type *return_type_local;
  
  comma = (char *)0x0;
  str = (char *)parameters;
  parameters_local = (exec_list *)name;
  name_local = (char *)return_type;
  if (return_type != (glsl_type *)0x0) {
    comma = ralloc_asprintf((void *)0x0,"%s ",return_type->name);
  }
  ralloc_asprintf_append(&comma,"%s(",parameters_local);
  param = (ir_variable *)0x29604e;
  bVar1 = exec_node_is_tail_sentinel(*(exec_node **)str);
  if (bVar1) {
    local_50 = 0;
  }
  else {
    if (*(long *)str == 0) {
      local_48 = 0;
    }
    else {
      local_48 = *(long *)str + -8;
    }
    local_50 = local_48;
  }
  local_38 = local_50;
  while (local_38 != 0) {
    ralloc_asprintf_append(&comma,"%s%s",param,*(undefined8 *)(*(long *)(local_38 + 0x20) + 0x10));
    param = (ir_variable *)anon_var_dwarf_a554;
    bVar1 = exec_node_is_tail_sentinel(*(exec_node **)(local_38 + 8));
    if (bVar1) {
      local_68 = 0;
    }
    else {
      if (*(long *)(local_38 + 8) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = *(long *)(local_38 + 8) + -8;
      }
      local_68 = local_60;
    }
    local_38 = local_68;
  }
  ralloc_strcat(&comma,")");
  return comma;
}

Assistant:

char *
prototype_string(const glsl_type *return_type, const char *name,
                 exec_list *parameters)
{
   char *str = NULL;

   if (return_type != NULL)
      str = ralloc_asprintf(NULL, "%s ", return_type->name);

   ralloc_asprintf_append(&str, "%s(", name);

   const char *comma = "";
   foreach_in_list(const ir_variable, param, parameters) {
      ralloc_asprintf_append(&str, "%s%s", comma, param->type->name);
      comma = ", ";
   }

   ralloc_strcat(&str, ")");
   return str;
}